

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O2

int __thiscall
ncnn::Interp::forward
          (Interp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  uint _w;
  uint _c;
  Mat *pMVar7;
  Mat *this_00;
  size_t sVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  float fVar13;
  float fVar14;
  int *piVar15;
  void *pvVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  int *piVar20;
  int *piVar21;
  long lVar22;
  void *pvVar23;
  void *pvVar24;
  float *pfVar25;
  void *pvVar26;
  void *pvVar27;
  ulong uVar28;
  int y;
  uint uVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  float *pfVar33;
  long lVar34;
  uint uVar35;
  ulong uVar36;
  long lVar37;
  void *pvVar38;
  int iVar39;
  uint uVar40;
  void *pvVar41;
  long lVar42;
  ulong uVar43;
  int iVar44;
  float *rows1_old;
  float *rows2_old;
  ulong uVar45;
  int dx;
  undefined4 *puVar46;
  long lVar47;
  uint uVar48;
  long lVar49;
  void *pvVar50;
  float fVar51;
  float fVar52;
  void *local_1e0;
  float *local_1a8;
  Mat local_168;
  Mat local_118;
  Mat local_c8;
  Mat local_78;
  
  pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = pMVar7->w;
  uVar6 = pMVar7->h;
  uVar19 = (ulong)uVar6;
  sVar8 = pMVar7->elemsize;
  _w = pMVar7[1].w;
  lVar31 = (long)(int)_w;
  if (pMVar7->dims == 2) {
    if (_w == uVar5) goto LAB_003c040e;
    Mat::create(this_00,_w,uVar6,sVar8,opt->blob_allocator);
    pvVar9 = this_00->data;
    if (pvVar9 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    iVar17 = this->resize_type;
    if (iVar17 == 2) {
      uVar36 = lVar31 * 0xc;
      if ((int)_w < 0) {
        uVar36 = 0xffffffffffffffff;
      }
      piVar21 = (int *)operator_new__(uVar36);
      linear_coeffs(uVar5,_w,piVar21,(float *)(piVar21 + lVar31),this->align_corner);
      uVar36 = 0;
      uVar43 = 0;
      if (0 < (int)_w) {
        uVar43 = (ulong)_w;
      }
      uVar28 = 0;
      if (0 < (int)uVar6) {
        uVar28 = uVar19;
      }
      for (; uVar36 != uVar28; uVar36 = uVar36 + 1) {
        iVar17 = pMVar7->w;
        sVar8 = pMVar7->elemsize;
        pvVar50 = pMVar7->data;
        iVar30 = this_00->w;
        sVar10 = this_00->elemsize;
        for (uVar45 = 0; uVar43 != uVar45; uVar45 = uVar45 + 1) {
          uVar4 = *(undefined8 *)(piVar21 + lVar31 + uVar45 * 2);
          uVar3 = *(undefined8 *)
                   ((long)pvVar50 + (long)piVar21[uVar45] * 4 + (long)iVar17 * uVar36 * sVar8);
          *(float *)((long)pvVar9 + uVar45 * 4 + sVar10 * uVar36 * (long)iVar30) =
               (float)((ulong)uVar3 >> 0x20) * (float)((ulong)uVar4 >> 0x20) +
               (float)uVar3 * (float)uVar4;
        }
      }
      operator_delete__(piVar21);
      iVar17 = this->resize_type;
    }
    else if (iVar17 == 1) {
      if (this->output_width == 0) {
        fVar51 = 1.0 / this->width_scale;
      }
      else {
        fVar51 = (float)(int)uVar5 / (float)(int)_w;
      }
      uVar18 = 0;
      if (0 < (int)_w) {
        uVar18 = _w;
      }
      if ((int)uVar6 < 1) {
        uVar19 = 0;
      }
      for (uVar36 = 0; uVar36 != uVar19; uVar36 = uVar36 + 1) {
        iVar17 = pMVar7->w;
        sVar8 = pMVar7->elemsize;
        pvVar50 = pMVar7->data;
        iVar30 = this_00->w;
        sVar10 = this_00->elemsize;
        for (lVar31 = 0; uVar18 != (uint)lVar31; lVar31 = lVar31 + 1) {
          iVar39 = (int)((float)(int)(uint)lVar31 * fVar51);
          iVar44 = uVar5 - 1;
          if (iVar39 <= (int)(uVar5 - 1)) {
            iVar44 = iVar39;
          }
          *(undefined4 *)((long)pvVar9 + lVar31 * 4 + sVar10 * uVar36 * (long)iVar30) =
               *(undefined4 *)((long)pvVar50 + (long)iVar44 * 4 + (long)iVar17 * uVar36 * sVar8);
        }
      }
      return 0;
    }
    if (iVar17 != 3) {
      return 0;
    }
    uVar36 = lVar31 * 0x14;
    if ((int)_w < 0) {
      uVar36 = 0xffffffffffffffff;
    }
    piVar21 = (int *)operator_new__(uVar36);
    cubic_coeffs(uVar5,_w,piVar21,(float *)(piVar21 + lVar31),this->align_corner);
    uVar36 = 0;
    uVar43 = 0;
    if (0 < (int)_w) {
      uVar43 = (ulong)_w;
    }
    if ((int)uVar6 < 1) {
      uVar19 = uVar36;
    }
    for (; uVar36 != uVar19; uVar36 = uVar36 + 1) {
      pvVar9 = pMVar7->data;
      iVar17 = pMVar7->w;
      sVar8 = pMVar7->elemsize;
      iVar30 = this_00->w;
      sVar10 = this_00->elemsize;
      pvVar50 = this_00->data;
      for (lVar49 = 0; uVar43 * 4 != lVar49; lVar49 = lVar49 + 4) {
        pfVar25 = (float *)(piVar21 + lVar31 + lVar49);
        pfVar33 = (float *)((long)pvVar9 +
                           (long)*(int *)((long)piVar21 + lVar49) * 4 +
                           (long)iVar17 * uVar36 * sVar8 + -4);
        *(float *)((long)pvVar50 + lVar49 + sVar10 * uVar36 * (long)iVar30) =
             pfVar33[3] * pfVar25[3] + pfVar33[1] * pfVar25[1] +
             pfVar33[2] * pfVar25[2] + *pfVar33 * *pfVar25;
      }
    }
  }
  else {
    uVar18 = pMVar7[1].h;
    lVar49 = (long)(int)uVar18;
    if (pMVar7->dims == 1) {
      Mat::create(this_00,_w,uVar18,uVar5,sVar8,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 != 0) {
        uVar19 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar19 = 0;
        }
        lVar31 = 0;
        for (uVar36 = 0; uVar36 != uVar19; uVar36 = uVar36 + 1) {
          lVar49 = (long)this_00->h * (long)this_00->w;
          uVar43 = this_00->elemsize;
          iVar17 = (int)((uVar43 * lVar49 + 0xf & 0xfffffffffffffff0) / uVar43);
          if (this_00->dims == 4) {
            iVar17 = (int)lVar49;
          }
          iVar17 = iVar17 * this_00->d;
          uVar2 = *(undefined4 *)((long)pMVar7->data + uVar36 * 4);
          if (iVar17 < 1) {
            iVar17 = 0;
          }
          pvVar9 = this_00->data;
          for (lVar49 = 0; iVar17 != (int)lVar49; lVar49 = lVar49 + 1) {
            *(undefined4 *)((long)pvVar9 + lVar49 * 4 + uVar43 * lVar31) = uVar2;
          }
          lVar31 = lVar31 + sVar8;
        }
        return 0;
      }
      return -100;
    }
    if (uVar18 == uVar6 && _w == uVar5) {
LAB_003c040e:
      if (this_00 != pMVar7) {
        piVar21 = pMVar7->refcount;
        if (piVar21 != (int *)0x0) {
          LOCK();
          *piVar21 = *piVar21 + 1;
          UNLOCK();
        }
        piVar21 = this_00->refcount;
        if (piVar21 != (int *)0x0) {
          LOCK();
          *piVar21 = *piVar21 + -1;
          UNLOCK();
          if (*piVar21 == 0) {
            if (this_00->allocator == (Allocator *)0x0) {
              free(this_00->data);
            }
            else {
              (*this_00->allocator->_vptr_Allocator[3])();
            }
          }
        }
        this_00->cstep = 0;
        this_00->data = (void *)0x0;
        this_00->refcount = (int *)0x0;
        *(undefined8 *)((long)&this_00->refcount + 4) = 0;
        *(undefined8 *)((long)&this_00->elemsize + 4) = 0;
        this_00->c = 0;
        this_00->dims = 0;
        this_00->w = 0;
        this_00->h = 0;
        this_00->d = 0;
        piVar21 = pMVar7->refcount;
        this_00->data = pMVar7->data;
        this_00->refcount = piVar21;
        this_00->elemsize = pMVar7->elemsize;
        this_00->elempack = pMVar7->elempack;
        this_00->allocator = pMVar7->allocator;
        iVar17 = pMVar7->w;
        iVar30 = pMVar7->h;
        iVar44 = pMVar7->d;
        this_00->dims = pMVar7->dims;
        this_00->w = iVar17;
        this_00->h = iVar30;
        this_00->d = iVar44;
        this_00->c = pMVar7->c;
        this_00->cstep = pMVar7->cstep;
        return 0;
      }
      return 0;
    }
    _c = pMVar7->c;
    uVar19 = (ulong)_c;
    Mat::create(this_00,_w,uVar18,_c,sVar8,opt->blob_allocator);
    if (this_00->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    iVar17 = this->resize_type;
    if (iVar17 == 2) {
      iVar17 = _w * 3 + uVar18 + uVar18 * 2;
      uVar36 = (long)iVar17 * 4;
      if (iVar17 < 0) {
        uVar36 = 0xffffffffffffffff;
      }
      piVar20 = (int *)operator_new__(uVar36);
      piVar21 = piVar20 + lVar31;
      pfVar25 = (float *)(piVar21 + lVar49);
      iVar17 = this->align_corner;
      linear_coeffs(uVar5,_w,piVar20,pfVar25,iVar17);
      linear_coeffs(uVar6,uVar18,piVar21,pfVar25 + lVar31 * 2,iVar17);
      uVar36 = 0;
      if (0 < (int)_c) {
        uVar36 = uVar19;
      }
      for (uVar43 = 0; uVar43 != uVar36; uVar43 = uVar43 + 1) {
        iVar17 = pMVar7->w;
        sVar8 = pMVar7->elemsize;
        lVar32 = pMVar7->cstep * uVar43 * sVar8;
        pvVar9 = pMVar7->data;
        uVar35 = this_00->w;
        uVar40 = this_00->h;
        pvVar50 = this_00->data;
        sVar10 = this_00->elemsize;
        sVar11 = this_00->cstep;
        local_168.cstep = 0;
        local_168.data = (void *)0x0;
        local_168.refcount._0_4_ = 0;
        local_168.refcount._4_4_ = 0;
        local_168.elemsize._0_4_ = 0;
        local_168._20_8_ = 0;
        local_168.h = 0;
        local_168.d = 0;
        local_168.c = 0;
        local_168.allocator = (Allocator *)0x0;
        local_168.dims = 0;
        local_168.w = 0;
        Mat::create(&local_168,uVar35,4,(Allocator *)0x0);
        local_118.cstep = 0;
        local_118.data = (void *)0x0;
        local_118.refcount._0_4_ = 0;
        local_118.refcount._4_4_ = 0;
        local_118.elemsize._0_4_ = 0;
        local_118._20_8_ = 0;
        local_118.h = 0;
        local_118.d = 0;
        local_118.c = 0;
        local_118.allocator = (Allocator *)0x0;
        local_118.dims = 0;
        local_118.w = 0;
        Mat::create(&local_118,uVar35,4,(Allocator *)0x0);
        lVar37 = sVar8 * (long)iVar17;
        uVar29 = uVar35;
        if ((int)uVar35 < 1) {
          uVar29 = 0;
        }
        if ((int)uVar40 < 1) {
          uVar40 = 0;
        }
        pvVar50 = (void *)((long)pvVar50 + sVar11 * sVar10 * uVar43);
        pvVar26 = local_168.data;
        pfVar33 = pfVar25 + lVar31 * 2;
        pvVar41 = local_118.data;
        iVar17 = -2;
        for (uVar28 = 0; uVar28 != uVar40; uVar28 = uVar28 + 1) {
          iVar30 = piVar21[uVar28];
          pvVar24 = pvVar26;
          pvVar23 = pvVar41;
          if (iVar30 != iVar17) {
            lVar42 = (long)iVar30;
            if (iVar30 == iVar17 + 1) {
              for (uVar45 = 0; pvVar24 = pvVar41, pvVar23 = pvVar26, uVar29 != uVar45;
                  uVar45 = uVar45 + 1) {
                uVar4 = *(undefined8 *)
                         ((long)pvVar9 + (long)piVar20[uVar45] * 4 + (lVar42 + 1) * lVar37 + lVar32)
                ;
                *(float *)((long)pvVar26 + uVar45 * 4) =
                     (float)((ulong)uVar4 >> 0x20) *
                     (float)((ulong)*(undefined8 *)(piVar20 + lVar31 + lVar49 + uVar45 * 2) >> 0x20)
                     + (float)uVar4 * (float)*(undefined8 *)(piVar20 + lVar31 + lVar49 + uVar45 * 2)
                ;
              }
            }
            else {
              for (uVar45 = 0; uVar29 != uVar45; uVar45 = uVar45 + 1) {
                iVar17 = piVar20[uVar45];
                fVar51 = (float)*(undefined8 *)(piVar20 + lVar31 + lVar49 + uVar45 * 2);
                fVar52 = (float)((ulong)*(undefined8 *)(piVar20 + lVar31 + lVar49 + uVar45 * 2) >>
                                0x20);
                uVar4 = *(undefined8 *)((long)pvVar9 + (long)iVar17 * 4 + lVar37 * lVar42 + lVar32);
                *(float *)((long)pvVar26 + uVar45 * 4) =
                     (float)((ulong)uVar4 >> 0x20) * fVar52 + (float)uVar4 * fVar51;
                uVar4 = *(undefined8 *)
                         ((long)pvVar9 + (long)iVar17 * 4 + (lVar42 + 1) * lVar37 + lVar32);
                *(float *)((long)pvVar41 + uVar45 * 4) =
                     (float)((ulong)uVar4 >> 0x20) * fVar52 + (float)uVar4 * fVar51;
              }
            }
          }
          pvVar41 = pvVar23;
          uVar4 = *(undefined8 *)pfVar33;
          for (lVar42 = 0; uVar29 != (uint)lVar42; lVar42 = lVar42 + 1) {
            *(float *)((long)pvVar50 + lVar42 * 4) =
                 *(float *)((long)pvVar41 + lVar42 * 4) * (float)((ulong)uVar4 >> 0x20) +
                 *(float *)((long)pvVar24 + lVar42 * 4) * (float)uVar4;
          }
          pfVar33 = pfVar33 + 2;
          pvVar50 = (void *)((long)pvVar50 + (long)(int)uVar35 * sVar10);
          pvVar26 = pvVar24;
          iVar17 = iVar30;
        }
        piVar15 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            if (local_118.allocator == (Allocator *)0x0) {
              free(local_118.data);
            }
            else {
              (*(local_118.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar15 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            if (local_168.allocator == (Allocator *)0x0) {
              free(local_168.data);
            }
            else {
              (*(local_168.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      operator_delete__(piVar20);
      iVar17 = this->resize_type;
    }
    else if (iVar17 == 1) {
      if (this->output_height == 0) {
        fVar51 = 1.0 / this->height_scale;
      }
      else {
        fVar51 = (float)(int)uVar6 / (float)(int)uVar18;
      }
      if (this->output_width == 0) {
        fVar52 = 1.0 / this->width_scale;
      }
      else {
        fVar52 = (float)(int)uVar5 / (float)(int)_w;
      }
      uVar36 = 0;
      uVar35 = 0;
      if (0 < (int)_w) {
        uVar35 = _w;
      }
      uVar40 = 0;
      if (0 < (int)uVar18) {
        uVar40 = uVar18;
      }
      uVar43 = 0;
      if (0 < (int)_c) {
        uVar43 = uVar19;
      }
      for (; uVar36 != uVar43; uVar36 = uVar36 + 1) {
        sVar8 = pMVar7->cstep;
        sVar10 = pMVar7->elemsize;
        pvVar9 = pMVar7->data;
        puVar46 = (undefined4 *)(this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data);
        for (uVar29 = 0; uVar29 != uVar40; uVar29 = uVar29 + 1) {
          iVar30 = (int)((float)(int)uVar29 * fVar51);
          if ((int)(uVar6 - 1) < (int)((float)(int)uVar29 * fVar51)) {
            iVar30 = uVar6 - 1;
          }
          for (uVar48 = 0; uVar35 != uVar48; uVar48 = uVar48 + 1) {
            iVar44 = uVar5 - 1;
            if ((int)((float)(int)uVar48 * fVar52) <= (int)(uVar5 - 1)) {
              iVar44 = (int)((float)(int)uVar48 * fVar52);
            }
            *puVar46 = *(undefined4 *)
                        ((long)pvVar9 +
                        (long)(int)(iVar44 + iVar30 * uVar5) * 4 + sVar8 * uVar36 * sVar10);
            puVar46 = puVar46 + 1;
          }
        }
      }
    }
    if (iVar17 != 3) {
      return 0;
    }
    iVar17 = _w * 5 + uVar18 * 5;
    uVar36 = (long)iVar17 * 4;
    if (iVar17 < 0) {
      uVar36 = 0xffffffffffffffff;
    }
    piVar21 = (int *)operator_new__(uVar36);
    piVar20 = piVar21 + lVar31;
    pfVar25 = (float *)(piVar20 + lVar49);
    cubic_coeffs(uVar5,_w,piVar21,pfVar25,this->align_corner);
    cubic_coeffs(uVar6,uVar18,piVar20,pfVar25 + (int)(_w * 4),this->align_corner);
    if ((int)_c < 1) {
      uVar19 = 0;
    }
    for (uVar36 = 0; uVar36 != uVar19; uVar36 = uVar36 + 1) {
      iVar17 = pMVar7->w;
      sVar8 = pMVar7->cstep;
      sVar10 = pMVar7->elemsize;
      pvVar9 = pMVar7->data;
      uVar5 = this_00->w;
      uVar6 = this_00->h;
      uVar43 = (ulong)uVar6;
      pvVar50 = this_00->data;
      sVar11 = this_00->elemsize;
      sVar12 = this_00->cstep;
      local_168.cstep = 0;
      local_168.data = (void *)0x0;
      local_168.refcount._0_4_ = 0;
      local_168.refcount._4_4_ = 0;
      local_168.elemsize._0_4_ = 0;
      local_168._20_8_ = 0;
      local_168.h = 0;
      local_168.d = 0;
      local_168.c = 0;
      local_168.allocator = (Allocator *)0x0;
      local_168.dims = 0;
      local_168.w = 0;
      Mat::create(&local_168,uVar5,4,(Allocator *)0x0);
      local_118.cstep = 0;
      local_118.data = (void *)0x0;
      local_118.refcount._0_4_ = 0;
      local_118.refcount._4_4_ = 0;
      local_118.elemsize._0_4_ = 0;
      local_118._20_8_ = 0;
      local_118.h = 0;
      local_118.d = 0;
      local_118.c = 0;
      local_118.allocator = (Allocator *)0x0;
      local_118.dims = 0;
      local_118.w = 0;
      Mat::create(&local_118,uVar5,4,(Allocator *)0x0);
      local_c8.cstep = 0;
      local_c8.data = (void *)0x0;
      local_c8.refcount._0_4_ = 0;
      local_c8.refcount._4_4_ = 0;
      local_c8.elemsize._0_4_ = 0;
      local_c8._20_8_ = 0;
      local_c8.h = 0;
      local_c8.d = 0;
      local_c8.c = 0;
      local_c8.allocator = (Allocator *)0x0;
      local_c8.dims = 0;
      local_c8.w = 0;
      Mat::create(&local_c8,uVar5,4,(Allocator *)0x0);
      local_78.cstep = 0;
      local_78.data = (void *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize._0_4_ = 0;
      local_78._20_8_ = 0;
      local_78.h = 0;
      local_78.d = 0;
      local_78.c = 0;
      local_78.allocator = (Allocator *)0x0;
      local_78.dims = 0;
      local_78.w = 0;
      Mat::create(&local_78,uVar5,4,(Allocator *)0x0);
      local_1e0 = local_78.data;
      lVar32 = sVar10 * (long)iVar17;
      uVar18 = uVar5;
      if ((int)uVar5 < 1) {
        uVar18 = 0;
      }
      if ((int)uVar6 < 1) {
        uVar43 = 0;
      }
      lVar42 = sVar8 * uVar36 * sVar10 + -4;
      lVar37 = (ulong)uVar18 * 4;
      pvVar50 = (void *)((long)pvVar50 + sVar12 * sVar11 * uVar36);
      pvVar26 = local_168.data;
      pvVar41 = local_118.data;
      pvVar24 = local_c8.data;
      local_1a8 = pfVar25 + (int)(_w * 4);
      iVar17 = -3;
      for (uVar28 = 0; uVar28 != uVar43; uVar28 = uVar28 + 1) {
        iVar30 = piVar20[uVar28];
        pvVar23 = local_1e0;
        pvVar27 = pvVar26;
        pvVar38 = pvVar24;
        pvVar16 = pvVar41;
        if (iVar30 != iVar17) {
          lVar34 = (long)iVar30;
          if (iVar30 == iVar17 + 1) {
            for (lVar22 = 0; pvVar23 = pvVar26, pvVar27 = pvVar41, pvVar38 = local_1e0,
                pvVar16 = pvVar24, lVar37 - lVar22 != 0; lVar22 = lVar22 + 4) {
              pfVar33 = (float *)(piVar21 + lVar31 + lVar49 + lVar22);
              pfVar1 = (float *)((long)pvVar9 +
                                (long)*(int *)((long)piVar21 + lVar22) * 4 +
                                (lVar34 + 2) * lVar32 + lVar42);
              *(float *)((long)pvVar26 + lVar22) =
                   pfVar1[3] * pfVar33[3] + pfVar1[1] * pfVar33[1] +
                   pfVar1[2] * pfVar33[2] + *pfVar1 * *pfVar33;
            }
          }
          else if (iVar30 == iVar17 + 2) {
            for (lVar22 = 0; pvVar23 = pvVar41, pvVar27 = pvVar24, pvVar38 = pvVar26,
                pvVar16 = local_1e0, lVar37 - lVar22 != 0; lVar22 = lVar22 + 4) {
              iVar17 = *(int *)((long)piVar21 + lVar22);
              pfVar33 = (float *)(piVar21 + lVar31 + lVar49 + lVar22);
              fVar51 = *pfVar33;
              fVar52 = pfVar33[1];
              fVar13 = pfVar33[2];
              fVar14 = pfVar33[3];
              pfVar33 = (float *)((long)pvVar9 + (long)iVar17 * 4 + (lVar34 + 1) * lVar32 + lVar42);
              *(float *)((long)pvVar26 + lVar22) =
                   pfVar33[3] * fVar14 + pfVar33[1] * fVar52 +
                   pfVar33[2] * fVar13 + *pfVar33 * fVar51;
              pfVar33 = (float *)((long)pvVar9 + (long)iVar17 * 4 + (lVar34 + 2) * lVar32 + lVar42);
              *(float *)((long)pvVar41 + lVar22) =
                   pfVar33[3] * fVar14 + pfVar33[1] * fVar52 +
                   pfVar33[2] * fVar13 + *pfVar33 * fVar51;
            }
          }
          else if (iVar30 == iVar17 + 3) {
            for (lVar22 = 0; pvVar23 = pvVar24, pvVar27 = local_1e0, pvVar38 = pvVar41,
                pvVar16 = pvVar26, lVar37 - lVar22 != 0; lVar22 = lVar22 + 4) {
              lVar47 = (long)*(int *)((long)piVar21 + lVar22);
              pfVar33 = (float *)(piVar21 + lVar31 + lVar49 + lVar22);
              fVar51 = *pfVar33;
              fVar52 = pfVar33[1];
              fVar13 = pfVar33[2];
              fVar14 = pfVar33[3];
              pfVar33 = (float *)((long)pvVar9 + lVar47 * 4 + lVar32 * lVar34 + lVar42);
              *(float *)((long)pvVar26 + lVar22) =
                   pfVar33[3] * fVar14 + pfVar33[1] * fVar52 +
                   pfVar33[2] * fVar13 + *pfVar33 * fVar51;
              pfVar33 = (float *)((long)pvVar9 + lVar47 * 4 + (lVar34 + 1) * lVar32 + lVar42);
              *(float *)((long)pvVar41 + lVar22) =
                   pfVar33[3] * fVar14 + pfVar33[1] * fVar52 +
                   pfVar33[2] * fVar13 + *pfVar33 * fVar51;
              pfVar33 = (float *)((long)pvVar9 + lVar47 * 4 + (lVar34 + 2) * lVar32 + lVar42);
              *(float *)((long)pvVar24 + lVar22) =
                   pfVar33[3] * fVar14 + pfVar33[1] * fVar52 +
                   pfVar33[2] * fVar13 + *pfVar33 * fVar51;
            }
          }
          else {
            for (lVar22 = 0; lVar37 - lVar22 != 0; lVar22 = lVar22 + 4) {
              lVar47 = (long)*(int *)((long)piVar21 + lVar22);
              pfVar33 = (float *)(piVar21 + lVar31 + lVar49 + lVar22);
              fVar51 = *pfVar33;
              fVar52 = pfVar33[1];
              fVar13 = pfVar33[2];
              fVar14 = pfVar33[3];
              pfVar33 = (float *)((long)pvVar9 + lVar47 * 4 + (lVar34 + -1) * lVar32 + lVar42);
              *(float *)((long)pvVar26 + lVar22) =
                   pfVar33[3] * fVar14 + pfVar33[1] * fVar52 +
                   pfVar33[2] * fVar13 + *pfVar33 * fVar51;
              pfVar33 = (float *)((long)pvVar9 + lVar47 * 4 + lVar32 * lVar34 + lVar42);
              *(float *)((long)pvVar41 + lVar22) =
                   pfVar33[3] * fVar14 + pfVar33[1] * fVar52 +
                   pfVar33[2] * fVar13 + *pfVar33 * fVar51;
              pfVar33 = (float *)((long)pvVar9 + lVar47 * 4 + (lVar34 + 1) * lVar32 + lVar42);
              *(float *)((long)pvVar24 + lVar22) =
                   pfVar33[3] * fVar14 + pfVar33[1] * fVar52 +
                   pfVar33[2] * fVar13 + *pfVar33 * fVar51;
              pfVar33 = (float *)((long)pvVar9 + lVar47 * 4 + (lVar34 + 2) * lVar32 + lVar42);
              *(float *)((long)local_1e0 + lVar22) =
                   pfVar33[3] * fVar14 + pfVar33[1] * fVar52 +
                   pfVar33[2] * fVar13 + *pfVar33 * fVar51;
            }
          }
        }
        pvVar41 = pvVar16;
        fVar51 = *local_1a8;
        fVar52 = local_1a8[1];
        fVar13 = local_1a8[2];
        fVar14 = local_1a8[3];
        for (lVar34 = 0; uVar18 != (uint)lVar34; lVar34 = lVar34 + 1) {
          *(float *)((long)pvVar50 + lVar34 * 4) =
               *(float *)((long)pvVar23 + lVar34 * 4) * fVar14 +
               *(float *)((long)pvVar41 + lVar34 * 4) * fVar52 +
               *(float *)((long)pvVar38 + lVar34 * 4) * fVar13 +
               *(float *)((long)pvVar27 + lVar34 * 4) * fVar51;
        }
        local_1a8 = local_1a8 + 4;
        pvVar50 = (void *)((long)pvVar50 + (long)(int)uVar5 * sVar11);
        pvVar26 = pvVar27;
        pvVar24 = pvVar38;
        local_1e0 = pvVar23;
        iVar17 = iVar30;
      }
      piVar15 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            free(local_78.data);
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar15 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            free(local_c8.data);
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar15 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            free(local_118.data);
          }
          else {
            (*(local_118.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar15 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            free(local_168.data);
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  operator_delete__(piVar21);
  return 0;
}

Assistant:

int Interp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw = reference_blob.w;
    int outh = reference_blob.h;

    if (dims == 1)
    {
        // special case for 2d resize on flattened blob
        top_blob.create(outw, outh, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < w; q++)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float v = bottom_blob[q];
            top_blob_c.fill(v);
        }

        return 0;
    }

    if (dims == 2)
    {
        if (outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(outw, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (resize_type == 1) // nearest
        {
            const float ws = output_width ? w / (float)outw : 1.f / width_scale;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                for (int x = 0; x < outw; x++)
                {
                    int in_x = std::min((int)(x * ws), (w - 1));
                    *outptr++ = ptr[in_x];
                }
            }
        }

        if (resize_type == 2) // bilinear
        {
            int* buf = new int[outw + outw * 2];

            int* xofs = buf;
            float* alpha = (float*)(buf + outw);

            linear_coeffs(w, outw, xofs, alpha, align_corner);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                const float* alphap = alpha;

                for (int x = 0; x < outw; x++)
                {
                    int sx = xofs[x];
                    const float* Sp = ptr + sx;
                    float a0 = alphap[0];
                    float a1 = alphap[1];
                    *outptr++ = Sp[0] * a0 + Sp[1] * a1;
                    alphap += 2;
                }
            }

            delete[] buf;
        }

        if (resize_type == 3) // bicubic
        {
            int* buf = new int[outw + outw * 4];

            int* xofs = buf;
            float* alpha = (float*)(buf + outw);

            cubic_coeffs(w, outw, xofs, alpha, align_corner);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                const float* alphap = alpha;

                for (int x = 0; x < outw; x++)
                {
                    int sx = xofs[x];
                    const float* Sp = ptr + sx;
                    float a0 = alphap[0];
                    float a1 = alphap[1];
                    float a2 = alphap[2];
                    float a3 = alphap[3];
                    *outptr++ = Sp[-1] * a0 + Sp[0] * a1 + Sp[1] * a2 + Sp[2] * a3;
                    alphap += 4;
                }
            }

            delete[] buf;
        }

        return 0;
    }

    if (outw == w && outh == h)
    {
        top_blob = bottom_blob;
        return 0;
    }

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (resize_type == 1) // nearest
    {
        const float hs = output_height ? h / (float)outh : 1.f / height_scale;
        const float ws = output_width ? w / (float)outw : 1.f / width_scale;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            for (int y = 0; y < outh; y++)
            {
                int in_y = std::min((int)(y * hs), (h - 1));
                for (int x = 0; x < outw; x++)
                {
                    int in_x = std::min((int)(x * ws), (w - 1));
                    *outptr++ = ptr[in_y * w + in_x];
                }
            }
        }
    }

    if (resize_type == 2) // bilinear
    {
        int* buf = new int[outw + outh + outw * 2 + outh * 2];

        int* xofs = buf;        //new int[outw];
        int* yofs = buf + outw; //new int[outh];

        float* alpha = (float*)(buf + outw + outh);           //new float[outw * 2];
        float* beta = (float*)(buf + outw + outh + outw * 2); //new float[outh * 2];

        linear_coeffs(w, outw, xofs, alpha, align_corner);
        linear_coeffs(h, outh, yofs, beta, align_corner);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; ++q)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bilinear_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    if (resize_type == 3) // bicubic
    {
        int* buf = new int[outw + outh + outw * 4 + outh * 4];

        int* xofs = buf;        //new int[outw];
        int* yofs = buf + outw; //new int[outh];

        float* alpha = (float*)(buf + outw + outh);           //new float[outw * 4];
        float* beta = (float*)(buf + outw + outh + outw * 4); //new float[outh * 4];

        cubic_coeffs(w, outw, xofs, alpha, align_corner);
        cubic_coeffs(h, outh, yofs, beta, align_corner);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bicubic_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    return 0;
}